

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_postfix_expr(gvisitor_t *self,gnode_postfix_expr_t *node)

{
  gnode_n gVar1;
  long lVar2;
  char *identifier;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  _Bool _Var7;
  _Bool _Var8;
  gnode_t *pgVar9;
  gnode_r *pgVar10;
  bool bVar11;
  gnode_t *local_f0;
  gnode_t *local_e8;
  gnode_t *local_d8;
  gnode_postfix_subexpr_t *local_d0;
  gnode_postfix_subexpr_t *local_c0;
  gnode_postfix_subexpr_t *local_b8;
  size_t local_b0;
  gnode_t *local_a8;
  gnode_t *val;
  size_t j;
  size_t n_1;
  _Bool is_real_assigment;
  gnode_n tag_1;
  gnode_postfix_subexpr_t *subnode_1;
  size_t i;
  size_t count;
  _Bool is_assignment;
  _Bool is_super;
  gnode_postfix_subexpr_t *subexpr_1;
  gnode_postfix_subexpr_t *subexpr;
  size_t n;
  gnode_t *v;
  char *value;
  gnode_identifier_expr_t *expr;
  gnode_n tag;
  gnode_postfix_subexpr_t *subnode;
  gnode_t *target;
  gnode_postfix_expr_t *node_local;
  gvisitor_t *self_local;
  
  if (node->id == (gnode_t *)0x0) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,"Invalid postfix expression.");
  }
  else {
    gvisit(self,node->id);
    subnode = (gnode_postfix_subexpr_t *)0x0;
    if ((((node->id != (gnode_t *)0x0) && (node->id->tag == NODE_IDENTIFIER_EXPR)) &&
        (subnode = *(gnode_postfix_subexpr_t **)&node->id[1].token,
        subnode != (gnode_postfix_subexpr_t *)0x0)) && ((subnode->base).tag == NODE_VARIABLE)) {
      subnode = (gnode_postfix_subexpr_t *)0x0;
    }
    if ((subnode == (gnode_postfix_subexpr_t *)0x0) || ((subnode->base).tag != NODE_ENUM_DECL)) {
      if ((node->id != (gnode_t *)0x0) &&
         ((node->id->tag == NODE_IDENTIFIER_EXPR &&
          (_Var7 = is_init_infinite_loop(self,(gnode_identifier_expr_t *)node->id,node->list), _Var7
          )))) {
        report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,"Infinite loop detected in init func.")
        ;
      }
      bVar11 = false;
      if ((node->id != (gnode_t *)0x0) && (bVar11 = false, node->id->tag == NODE_KEYWORD_EXPR)) {
        bVar11 = (node->id->token).type == TOK_KEY_SUPER;
      }
      _Var7 = (node->base).is_assignment;
      if (node->list == (gnode_r *)0x0) {
        local_d0 = (gnode_postfix_subexpr_t *)0x0;
      }
      else {
        local_d0 = (gnode_postfix_subexpr_t *)node->list->n;
      }
      for (subnode_1 = (gnode_postfix_subexpr_t *)0x0; subnode_1 < local_d0;
          subnode_1 = (gnode_postfix_subexpr_t *)((long)&(subnode_1->base).tag + 1)) {
        if (subnode_1 < (gnode_postfix_subexpr_t *)node->list->n) {
          local_d8 = node->list->p[(long)subnode_1];
        }
        else {
          local_d8 = (gnode_t *)0x0;
        }
        gVar1 = local_d8->tag;
        if ((_Var7 & 1U) != 0 &&
            (gnode_postfix_subexpr_t *)((long)&(subnode_1->base).tag + 1U) == local_d0) {
          if (gVar1 == NODE_CALL_EXPR) {
            report_error(self,GRAVITY_ERROR_SEMANTIC,local_d8,
                         "Unable to assign a value to a function call.");
            return;
          }
          if (bVar11) {
            report_error(self,GRAVITY_ERROR_SEMANTIC,local_d8,"Unable to explicitly modify super.");
            return;
          }
        }
        if (gVar1 == NODE_CALL_EXPR) {
          lVar4._0_4_ = local_d8[1].tag;
          lVar4._4_4_ = local_d8[1].refcount;
          if (lVar4 == 0) {
            local_e8 = (gnode_t *)0x0;
          }
          else {
            local_e8 = (gnode_t *)**(ulong **)(local_d8 + 1);
          }
          for (val = (gnode_t *)0x0; val < local_e8; val = (gnode_t *)((long)&val->tag + 1)) {
            if (val < (gnode_t *)**(ulong **)(local_d8 + 1)) {
              local_f0 = *(gnode_t **)(*(long *)(*(long *)(local_d8 + 1) + 0x10) + (long)val * 8);
            }
            else {
              local_f0 = (gnode_t *)0x0;
            }
            _Var8 = is_expression_assignment(local_f0);
            if (_Var8) {
              report_error(self,GRAVITY_ERROR_SEMANTIC,local_f0,
                           "Assignment does not have side effects and so cannot be used as function argument."
                          );
              return;
            }
            gvisit(self,local_f0);
          }
        }
        else if (gVar1 == NODE_SUBSCRIPT_EXPR) {
          lVar5._0_4_ = local_d8[1].tag;
          lVar5._4_4_ = local_d8[1].refcount;
          if (lVar5 != 0) {
            gvisit(self,*(gnode_t **)(local_d8 + 1));
          }
        }
        else {
          if (gVar1 != NODE_ACCESS_EXPR) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_semacheck2.c"
                          ,0x473,"void visit_postfix_expr(gvisitor_t *, gnode_postfix_expr_t *)");
          }
          lVar6._0_4_ = local_d8[1].tag;
          lVar6._4_4_ = local_d8[1].refcount;
          if ((lVar6 == 0) || (**(int **)(local_d8 + 1) != 0x12)) {
            report_error(self,GRAVITY_ERROR_SEMANTIC,*(gnode_t **)(local_d8 + 1),
                         "Invalid access expression.");
          }
        }
      }
    }
    else {
      if (node->list->n == 0) {
        local_a8 = (gnode_t *)0x0;
      }
      else {
        local_a8 = *node->list->p;
      }
      if (local_a8->tag == NODE_ACCESS_EXPR) {
        if (((node->base).is_assignment & 1U) == 0) {
          lVar2._0_4_ = local_a8[1].tag;
          lVar2._4_4_ = local_a8[1].refcount;
          if ((lVar2 == 0) || (**(int **)(local_a8 + 1) != 0x12)) {
            report_error(self,GRAVITY_ERROR_SEMANTIC,local_a8,"Invalid enum expression.");
          }
          else {
            identifier = *(char **)(*(long *)(local_a8 + 1) + 0x48);
            pgVar9 = lookup_node(&subnode->base,identifier);
            if (pgVar9 == (gnode_t *)0x0) {
              uVar3._0_4_ = subnode[1].base.token.type;
              uVar3._4_4_ = subnode[1].base.token.lineno;
              report_error(self,GRAVITY_ERROR_SEMANTIC,local_a8,"Unable to find %s in enum %s.",
                           identifier,uVar3);
            }
            else {
              if (node->list == (gnode_r *)0x0) {
                local_b0 = 0;
              }
              else {
                local_b0 = node->list->n;
              }
              if (local_b0 == 1) {
                gnode_free(node->id);
                if (node->list->n == 0) {
                  local_b8 = (gnode_postfix_subexpr_t *)0x0;
                }
                else {
                  local_b8 = (gnode_postfix_subexpr_t *)*node->list->p;
                }
                free_postfix_subexpr(local_b8);
                if (node->list->p != (gnode_t **)0x0) {
                  free(node->list->p);
                }
                free(node->list);
                node->list = (gnode_r *)0x0;
                pgVar9 = gnode_duplicate(pgVar9,false);
                node->id = pgVar9;
              }
              else {
                gnode_free(node->id);
                pgVar9 = gnode_duplicate(pgVar9,false);
                node->id = pgVar9;
                if (node->list->n == 0) {
                  local_c0 = (gnode_postfix_subexpr_t *)0x0;
                }
                else {
                  local_c0 = (gnode_postfix_subexpr_t *)*node->list->p;
                }
                free_postfix_subexpr(local_c0);
                pgVar10 = gnode_array_remove_byindex(node->list,0);
                node->list = pgVar10;
              }
            }
          }
        }
        else {
          report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                       "Assignment not allowed for an enum type.");
        }
      }
      else {
        report_error(self,GRAVITY_ERROR_SEMANTIC,node->id,"Invalid enum expression.");
      }
    }
  }
  return;
}

Assistant:

static void visit_postfix_expr (gvisitor_t *self, gnode_postfix_expr_t *node) {
    DEBUG_CODEGEN("visit_postfix_expr");

    // node->list usually cannot be NULL, it is NULL only as a result of a static enum transformation (see semacheck2.c)
    if (node->list == NULL) {
        visit(node->id);
        return;
    }

    DECLARE_CODE();
    CODEGEN_COUNT_REGISTERS(n1);
    ircode_push_context(code);

    // disable MOVE optimization
	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));

    // generate code for the common id node
    visit(node->id);

    bool is_super = IS_SUPER(node->id);

    // register that contains callable object
    uint32_t target_register = ircode_register_pop_context_protect(code, true);
    if (target_register == REGISTER_ERROR) {
        report_error(self, (gnode_t *)node->id, "Invalid postfix expression.");
        return;
    }

    // register where to store final result
    uint32_t dest_register = target_register;

    // mandatory self register (initialized to 0 in case of implicit self or explicit super)
    uint32_r self_list; marray_init(self_list);
    uint32_t first_self_register = compute_self_register(self, code, node->id, target_register, node->list);
    if (first_self_register == UINT32_MAX) return;
    marray_push(uint32_t, self_list, first_self_register);

    // process each subnode and set is_assignment flag
    bool is_assignment = node->base.is_assignment;
    size_t count = gnode_array_size(node->list);

    for (size_t i=0; i<count; ++i) {
        // a subnode can be a CALL_EXPR     => id.()
        // a NODE_ACCESS_EXPR               => id.id2
        // a NODE_SUBSCRIPT_EXPR            => id[]
        // or ANY combination of the them!  => id.id2.id3()[24]().id5()
        gnode_postfix_subexpr_t *subnode = (gnode_postfix_subexpr_t *)gnode_array_get(node->list, i);

        // identify postfix type: NODE_CALL_EXPR, NODE_ACCESS_EXPR, NODE_SUBSCRIPT_EXPR
        gnode_n tag = subnode->base.tag;

        // check assignment flag
        bool is_real_assigment = (is_assignment && IS_LAST_LOOP(i, count));

        if (tag == NODE_CALL_EXPR) {
            // a CALL instruction needs to properly prepare stack before execution
            // format is CALL A B C

            // where A is the destination register
            // B is the callable object
            // and C is the number of arguments passed to the CALL
            // arguments must be on the stack (so gravity VM can use a register window in order to speed up instruction)
            // and are expected to be starting from B+1

            // check dest register
            bool dest_is_temp = ircode_register_istemp(code, dest_register);
            if (!dest_is_temp) {
                dest_register = ircode_register_push_temp(code);
                dest_is_temp = true;
            }

            // add target register (must be temp)
            uint32_t temp_target_register = ircode_register_push_temp(code);
			ircode_add(code, MOVE, temp_target_register, target_register, 0, LINE_NUMBER(node));
            uint32_t treg = ircode_register_pop_context_protect(code, true);
            if (treg == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode, "Unexpected register error.");
                return;
            }

            // always add SELF parameter (must be temp+1)
            uint32_t self_register = marray_pop(self_list);
            uint32_t temp_self_register = ircode_register_push_temp(code);
			ircode_add(code, MOVE, temp_self_register, self_register, 0, LINE_NUMBER(node));
            treg = ircode_register_pop_context_protect(code, true);
            if (treg == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode, "Unexpected register error.");
                return;
            }

            // process each parameter (each must be temp+2 ... temp+n)
            marray_decl_init(uint32_r, args);
            size_t n = gnode_array_size(subnode->args);
            for (size_t j=0; j<n; ++j) {
                // process each argument
                gnode_t *arg = (gnode_t *)gnode_array_get(subnode->args, j);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
                visit(arg);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
                uint32_t nreg = ircode_register_pop_context_protect(code, true);
                if (nreg == REGISTER_ERROR) {
                    report_error(self, (gnode_t *)arg, "Invalid argument expression at index %d.", j+1);
                    return;
                }

                // make sure args are in consecutive register locations (from temp_target_register + 1 to temp_target_register + n)
                if (nreg != temp_target_register + j + 2) {
                    uint32_t temp = ircode_register_push_temp(code);
                    if (temp == 0) return; // temp value == 0 means codegen error (error will be automatically reported later in visit_function_decl
					ircode_add(code, MOVE, temp, nreg, 0, LINE_NUMBER(node));
                    ircode_register_clear(code, nreg);
                    nreg = ircode_register_pop_context_protect(code, true);
                    if (nreg == REGISTER_ERROR) {
                        report_error(self, (gnode_t *)arg, "Invalid argument expression");
                        return;
                    }
                }
                if (nreg != temp_target_register + j + 2) {
                    report_error(self, (gnode_t *)arg, "Invalid register computation in call expression.");
                    return;
                }
                
                // a checkpoint should be added after each nreg computation in order to support STRUCT
                // I'll skip this overhead in this version because it should be a type based decision
                // ircode_add_check(code, nreg);
                marray_push(uint32_t, args, nreg);
            }

            // generate instruction CALL with count parameters (taking in account self)
			ircode_add(code, CALL, dest_register, temp_target_register, (uint32_t)n+1, LINE_NUMBER(node));

            // cleanup temp registers
            ircode_register_clear(code, temp_target_register);
            ircode_register_clear(code, temp_self_register);
            n = gnode_array_size(subnode->args);
            for (size_t j=0; j<n; ++j) {
                uint32_t reg = marray_get(args, j);
                ircode_register_clear(code, reg);
            }

            // update self list
            marray_push(uint32_t, self_list, dest_register);

            // a call returns a value
            if (IS_LAST_LOOP(i, count)) {
                if (ircode_register_count(code)) {
                    // code added in order to protect the extra register pushed in case
                    // of code like: f(20)(30)
                    uint32_t last_register = ircode_register_last(code);
                    if (last_register == REGISTER_ERROR) {
                        report_error(self, (gnode_t *)subnode, "Invalid call expression.");
                        return;
                    }
                    if (dest_is_temp && last_register == dest_register) dest_is_temp = false;
                }
                if (dest_is_temp) ircode_register_push(code, dest_register);
                if (!ircode_register_protect_outside_context(code, dest_register)) {
                    report_error(self, (gnode_t *)subnode, "Invalid register access.");
                    return;
                }
            }

            // free temp args array
            marray_destroy(args);

        } else if (tag == NODE_ACCESS_EXPR) {
            // process identifier node (semantic check assures that each node is an identifier)
            gnode_identifier_expr_t *expr = (gnode_identifier_expr_t *)subnode->expr;
            uint32_t index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, expr->value));
            uint32_t index_register = ircode_register_push_temp(code);
			ircode_add(code, LOADK, index_register, index, 0, LINE_NUMBER(expr));
            uint32_t temp = ircode_register_pop(code);
            if (temp == REGISTER_ERROR) {
                report_error(self, (gnode_t *)expr, "Invalid access expression.");
                return;
            }

            // generate LOAD/STORE instruction
            dest_register = (is_real_assigment) ? ircode_register_pop(code) : ircode_register_push_temp(code);
            if (dest_register == REGISTER_ERROR) {
                report_error(self, (gnode_t *)expr, "Invalid access expression.");
                return;
            }

            if (is_super) {
                gravity_class_t *class = context_get_class(self);
                if (!class) {
                    report_error(self, (gnode_t *)node, "Unable to use super keyword in a non class context.");
                    return;
                }
                
                // check if class has a superclass not yet processed
                const char *identifier = lookup_superclass_identifier (self, class);
                if (!identifier) {
                    // it means that class superclass has already been processed
                    class = class->superclass;
                    identifier = (class) ? class->identifier : GRAVITY_CLASS_OBJECT_NAME;
                }
                
                uint32_t cpool_index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, identifier));
                ircode_add_constant(code, cpool_index, LINE_NUMBER(node));
                uint32_t temp_reg = ircode_register_pop(code);
                ircode_add(code, LOADS, dest_register, temp_reg, index_register, LINE_NUMBER(node));
            } else {
                ircode_add(code, (is_real_assigment) ? STORE : LOAD, dest_register, target_register, index_register, LINE_NUMBER(node));
            }
            
            if (!is_real_assigment) {
                if (i+1<count) {
                uint32_t rtemp = ircode_register_pop_context_protect(code, true);
                if (rtemp == REGISTER_ERROR) {
                    report_error(self, (gnode_t *)expr, "Unexpected register error.");
                    return;
                }
                } else {
                    // last loop
                    if (ircode_register_istemp(code, dest_register))
                        ircode_register_protect_outside_context(code, dest_register);
                }
            }

            // update self list (if latest instruction)
            // this was added in order to properly emit instructions for nested_class.gravity unit test
            if (!IS_LAST_LOOP(i, count)) {
                gnode_postfix_subexpr_t *nextnode = (gnode_postfix_subexpr_t *)gnode_array_get(node->list, i+1);
                if (nextnode->base.tag != NODE_CALL_EXPR) marray_push(uint32_t, self_list, dest_register);
            }

        } else if (tag == NODE_SUBSCRIPT_EXPR) {
            // process index
			ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
            visit(subnode->expr);
			ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
            uint32_t index = ircode_register_pop(code);
            if (index == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode->expr, "Invalid subscript expression.");
                return;
            }

            // generate LOADAT/STOREAT instruction
            dest_register = (is_real_assigment) ? ircode_register_pop(code) : ircode_register_push_temp(code);
            if (dest_register == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode->expr, "Invalid subscript expression.");
                return;
            }
			ircode_add(code, (is_real_assigment) ? STOREAT : LOADAT, dest_register, target_register, index, LINE_NUMBER(node));
            if ((!is_real_assigment) && (i+1<count)) {
                uint32_t rtemp = ircode_register_pop_context_protect(code, true);
                if (rtemp == REGISTER_ERROR) {
                    report_error(self, (gnode_t *)subnode->expr, "Unexpected register error.");
                    return;
                }
                marray_push(uint32_t, self_list, rtemp);
            }
        }

        // reset is_super flag
        is_super = false;

        // update target
        target_register = dest_register;
    }

    marray_destroy(self_list);
    ircode_pop_context(code);

    // temp fix for not optimal register allocation algorithm generated code
    uint32_t temp_register = ircode_register_first_temp_available(code);
    if (temp_register < dest_register) {
        // free dest register
        ircode_register_pop(code);
        // allocate a new register (that I am now sure does not have holes)
        temp_register = ircode_register_push_temp(code);
        ircode_add(code, MOVE, temp_register, dest_register, 0, LINE_NUMBER(node));
        ircode_register_clear(code, dest_register);
    }
    
    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, (is_assignment) ? -1 : 1);

    // re-enable MOVE optimization
	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
}